

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

void density_tests::detail::
     PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
     ::
     put_impl<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::put_transaction<density_tests::detail::PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::Data>>
               (put_transaction<density_tests::detail::PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::Data>
                *i_transaction,EasyRandom *i_rand)

{
  put_transaction<density_tests::detail::PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::Data>
  *this;
  int32_t iVar1;
  unsigned_long uVar2;
  vector<char_*,_std::allocator<char_*>_> *this_00;
  uint uVar3;
  size_t i_size;
  long lVar4;
  char *chars;
  put_transaction<density_tests::detail::PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::Data>
  *local_48;
  EasyRandom *local_40;
  ulong local_38;
  
  local_48 = i_transaction;
  local_40 = i_rand;
  uVar2 = EasyRandom::get_int<unsigned_long>(i_rand,0,200);
  this = local_48;
  lVar4 = -uVar2;
  uVar3 = (int)uVar2 + 0x30;
  i_size = uVar2 + 1;
  while( true ) {
    if (lVar4 == 0) break;
    local_38 = uVar2;
    chars = (char *)density::
                    lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                    ::
                    put_transaction<density_tests::detail::PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::Data>
                    ::raw_allocate(this,i_size,1);
    memset(chars,(uint)(byte)((char)uVar3 + (char)(uVar2 / 10) * -10),i_size - 1);
    chars[i_size - 1] = '\0';
    this_00 = (vector<char_*,_std::allocator<char_*>_> *)
              density::
              lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
              ::
              put_transaction<density_tests::detail::PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::Data>
              ::element_ptr(this);
    std::vector<char_*,_std::allocator<char_*>_>::push_back(this_00,&chars);
    iVar1 = EasyRandom::get_bool(local_40,0.05);
    if (iVar1 != 0) {
      exception_checkpoint();
    }
    lVar4 = lVar4 + 1;
    uVar3 = (uint)(byte)((char)uVar3 - 1);
    uVar2 = local_38 - 1;
    i_size = i_size - 1;
  }
  exception_checkpoint();
  return;
}

Assistant:

static void put_impl(PUT_TRANSACTION & i_transaction, EasyRandom & i_rand)
            {
                size_t count = i_rand.get_int<size_t>(0, 200);
                for (size_t index = 0; index < count; index++)
                {
                    auto const size      = count - index;
                    auto const fill_char = static_cast<char>('0' + size % 10);
                    auto const chars = static_cast<char *>(i_transaction.raw_allocate(size + 1, 1));
                    memset(chars, fill_char, size);
                    chars[size] = 0;
                    i_transaction.element().m_blocks.push_back(chars);

                    if (i_rand.get_bool(.05))
                    {
                        exception_checkpoint();
                    }
                }
                exception_checkpoint();
            }